

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32ppcbe.c
# Opt level: O1

void morphos_writeexec(GlobalVars *gv,FILE *f)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  Section *pSVar3;
  node *pnVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  Section *n;
  LinkedSection *pLVar8;
  uint8_t *puVar9;
  Section *pSVar10;
  node *pnVar11;
  node *n_00;
  size_t size;
  LinkedSection *ls;
  
  ls = (LinkedSection *)(gv->lnksec).first;
  if ((ls->n).next != (node *)0x0) {
    bVar5 = false;
    bVar6 = false;
    do {
      if ((ls->flags & 4) != 0) {
        if (ls->type == '\x03') {
          if (bVar6) {
            error(0x7c,fff[gv->dest_format]->tname);
          }
          ls->name = ".sbss";
          bVar6 = true;
        }
        else if (ls->type == '\x02') {
          n = find_first_bss_sec(ls);
          if (bVar5) {
            error(0x7c,fff[gv->dest_format]->tname);
          }
          ls->name = ".sdata";
          bVar5 = true;
          if ((n != (Section *)0x0) && (ls->filesize < ls->size)) {
            n_00 = (ls->symbols).first;
            uVar1 = n->offset;
            uVar2 = ls->base;
            pLVar8 = create_lnksect(gv,".sbss",'\x03',ls->flags | 2,ls->protection,ls->alignment,
                                    ls->memattr);
            size = ls->size - n->offset;
            pLVar8->size = size;
            puVar9 = (uint8_t *)alloc(size);
            pLVar8->data = puVar9;
            pSVar3 = (Section *)(n->n).next;
            if (pSVar3 != (Section *)0x0) {
              do {
                pSVar10 = pSVar3;
                remnode(&n->n);
                addtail(&pLVar8->sections,&n->n);
                n->lnksec = pLVar8;
                n->offset = n->offset - uVar1;
                pSVar3 = (Section *)(pSVar10->n).next;
                n = pSVar10;
              } while (pSVar3 != (Section *)0x0);
            }
            pnVar4 = n_00->next;
            if (pnVar4 != (node *)0x0) {
              do {
                pnVar11 = pnVar4;
                if ((LinkedSection *)n_00[3].pred[1].pred == pLVar8) {
                  remnode(n_00);
                  addtail(&pLVar8->symbols,n_00);
                  n_00[3].next = (node *)((long)n_00[3].next - (uVar2 + uVar1));
                }
                pnVar4 = pnVar11->next;
                n_00 = pnVar11;
              } while (pnVar4 != (node *)0x0);
            }
            ls->size = ls->size - pLVar8->size;
          }
        }
      }
      if ((ls->flags & 2) == 0) {
        ls->filesize = ls->size;
      }
      iVar7 = strcmp(ls->name,ddrelocs_name);
      if (iVar7 == 0) {
        make_ddrelocs(gv,ls);
      }
      ls = (LinkedSection *)(ls->n).next;
    } while ((ls->n).next != (node *)0x0);
  }
  elf32_writeobject(gv,f,0x14,'\x01',ppc32_reloc_vlink2elf);
  return;
}

Assistant:

static void morphos_writeexec(struct GlobalVars *gv,FILE *f)
/* creates a target-elf32morphos executable file, which in */
/* reality is a relocatable object too, but all symbol references have */
/* been resolved */
{
  struct LinkedSection *ls;
  int sdflag=0,sbflag=0;

  for (ls=(struct LinkedSection *)gv->lnksec.first; ls->n.next!=NULL;
       ls=(struct LinkedSection *)ls->n.next) {

    if (ls->flags & SF_SMALLDATA) {
      /* data sections should be called .sdata, and bss sections .sbss */

      if (ls->type == ST_DATA) {  /* .sdata */
        struct Section *bss_sec = find_first_bss_sec(ls);

        if (sdflag)
          error(124,fff[gv->dest_format]->tname);
        sdflag = 1;
        ls->name = sdata_name;

        if (bss_sec && (ls->filesize < ls->size)) {
          /* put bss-part of .sdata into an own section called .sbss */
          struct LinkedSection *sbss;
          struct Section *sec = bss_sec;
          struct Section *nextsec;
          struct Symbol *sym = (struct Symbol *)ls->symbols.first;
          struct Symbol *nextsym;
          unsigned long bss_offset = bss_sec->offset;
          lword bss_va = (lword)(ls->base + bss_offset);

          sbss = create_lnksect(gv,sbss_name,ST_UDATA,
                                ls->flags|SF_UNINITIALIZED,
                                ls->protection,ls->alignment,ls->memattr);
          sbss->size = ls->size - bss_sec->offset;
          sbss->data = alloc(sbss->size);

          /* move bss sections from .sdata to .sbss */
          while (nextsec = (struct Section *)sec->n.next) {
            remnode(&sec->n);
            addtail(&sbss->sections,&sec->n);
            sec->lnksec = sbss;
            sec->offset -= bss_offset;
            sec = nextsec;
          }

          /* move symbols */
          while (nextsym = (struct Symbol *)sym->n.next) {
            /* move bss symbols to .sbss */
            if (sym->relsect->lnksec == sbss) {
              remnode(&sym->n);
              addtail(&sbss->symbols,&sym->n);
              sym->value -= bss_va;
            }
            sym = nextsym;
          }
          /* no relocs and no xrefs can occur in bss */

          ls->size -= sbss->size;  /* the bss part is gone */
        }
      }

      else if (ls->type == ST_UDATA) {
        if (sbflag)
          error(124,fff[gv->dest_format]->tname);
        sbflag = 1;
        ls->name = sbss_name;
      }
    }

    /* set filesize to memsize for all sections */
    if (!(ls->flags & SF_UNINITIALIZED))
      ls->filesize = ls->size;

    /* setup ddrelocs section, if present */
    if (!strcmp(ls->name,ddrelocs_name))
      make_ddrelocs(gv,ls);
  }

  elf32_writeobject(gv,f,EM_PPC,_BIG_ENDIAN_,ppc32_reloc_vlink2elf);
}